

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O1

RegEx * YAML::Exp::ValueInFlow(void)

{
  int iVar1;
  RegEx *ex1;
  string local_90;
  RegEx local_70;
  RegEx local_50;
  RegEx local_30;
  
  if (ValueInFlow()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&ValueInFlow()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(&local_30,':');
      ex1 = BlankOrBreak();
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,",]}","");
      RegEx::RegEx(&local_70,&local_90,REGEX_OR);
      operator|(&local_50,ex1,&local_70);
      operator+(&ValueInFlow::e,&local_30,&local_50);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_50.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_70.m_params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_30.m_params);
      __cxa_atexit(RegEx::~RegEx,&ValueInFlow::e,&__dso_handle);
      __cxa_guard_release(&ValueInFlow()::e);
    }
  }
  return &ValueInFlow::e;
}

Assistant:

inline const RegEx& ValueInFlow() {
  static const RegEx e = RegEx(':') + (BlankOrBreak() | RegEx(",]}", REGEX_OR));
  return e;
}